

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentsHelper.cxx
# Opt level: O1

void __thiscall cmCommandArgument::ApplyOwnGroup(cmCommandArgument *this)

{
  pointer __v;
  
  if ((this->Group != (cmCommandArgumentGroup *)0x0) &&
     (__v = (this->Group->ContainedArguments).
            super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
            super__Vector_impl_data._M_start,
     __v != (this->Group->ContainedArguments).
            super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
            super__Vector_impl_data._M_finish)) {
    do {
      if (*__v != this) {
        std::
        _Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
        ::_M_insert_unique<cmCommandArgument_const*const&>
                  ((_Rb_tree<cmCommandArgument_const*,cmCommandArgument_const*,std::_Identity<cmCommandArgument_const*>,std::less<cmCommandArgument_const*>,std::allocator<cmCommandArgument_const*>>
                    *)&this->ArgumentsBefore,__v);
      }
      __v = __v + 1;
    } while (__v != (this->Group->ContainedArguments).
                    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void cmCommandArgument::ApplyOwnGroup()
{
  if (this->Group != CM_NULLPTR) {
    for (std::vector<cmCommandArgument*>::const_iterator it =
           this->Group->ContainedArguments.begin();
         it != this->Group->ContainedArguments.end(); ++it) {
      if (*it != this) {
        this->ArgumentsBefore.insert(*it);
      }
    }
  }
}